

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::BayesianProbitRegressor::_InternalSerialize
          (BayesianProbitRegressor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  Type *value;
  undefined8 *puVar4;
  ulong uVar5;
  int index;
  
  if (this->numberoffeatures_ != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (1,this->numberoffeatures_,puVar3);
  }
  if ((this != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) &&
     (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                       (2,this->bias_,puVar3,stream);
  }
  iVar1 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                      (&(this->features_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                       (3,value,puVar3,stream);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,
                        (string *)
                        ((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xb,
                        (string *)
                        ((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,
                        (string *)
                        ((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
           );
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd,
                        (string *)
                        ((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x14,
                        (string *)
                        ((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                        ),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x15,
                        (string *)
                        ((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
              );
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x16,
                        (string *)
                        ((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  puVar4 = (undefined8 *)
           ((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  lVar2 = puVar4[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,(int)lVar2,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x17,
                        (string *)
                        ((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe),target);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) == 0) {
    return target;
  }
  uVar5 = uVar5 & 0xfffffffffffffffc;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar5 + 8),*(int *)(uVar5 + 0x10),target);
  return puVar3;
}

Assistant:

uint8_t* BayesianProbitRegressor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BayesianProbitRegressor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt32ToArray(1, this->_internal_numberoffeatures(), target);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::bias(this), target, stream);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_features_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_features(i), target, stream);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_regressioninputfeaturename().data(), static_cast<int>(this->_internal_regressioninputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_regressioninputfeaturename(), target);
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_optimisminputfeaturename().data(), static_cast<int>(this->_internal_optimisminputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        11, this->_internal_optimisminputfeaturename(), target);
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingscaleinputfeaturename().data(), static_cast<int>(this->_internal_samplingscaleinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_samplingscaleinputfeaturename(), target);
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_samplingtruncationinputfeaturename().data(), static_cast<int>(this->_internal_samplingtruncationinputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_samplingtruncationinputfeaturename(), target);
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_meanoutputfeaturename().data(), static_cast<int>(this->_internal_meanoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_meanoutputfeaturename(), target);
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_varianceoutputfeaturename().data(), static_cast<int>(this->_internal_varianceoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        21, this->_internal_varianceoutputfeaturename(), target);
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_pessimisticprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_pessimisticprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        22, this->_internal_pessimisticprobabilityoutputfeaturename(), target);
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_sampledprobabilityoutputfeaturename().data(), static_cast<int>(this->_internal_sampledprobabilityoutputfeaturename().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    target = stream->WriteStringMaybeAliased(
        23, this->_internal_sampledprobabilityoutputfeaturename(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BayesianProbitRegressor)
  return target;
}